

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_dateVal(Context *context,IntrinsicResult partialResult)

{
  time_t tVar1;
  Value *value;
  double dVar2;
  Value date;
  Value local_60;
  time_t t;
  String local_48;
  Value local_38;
  Value local_28;
  
  MiniScript::String::String(&local_48,"dateStr");
  MiniScript::Context::GetVar((Context *)&date,(String *)partialResult.rs,(LocalOnlyMode)&local_48);
  MiniScript::String::release(&local_48);
  if (date.type == Number) {
    value = &local_28;
    local_28.type = true;
    local_28.noInvoke = date.noInvoke;
    local_28.localOnly = date.localOnly;
    local_28.data = date.data;
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,value,true);
  }
  else {
    if (date.type == Null) {
      time(&t);
      tVar1 = t;
    }
    else {
      MiniScript::Value::ToString(&local_60,(Machine *)&date);
      tVar1 = MiniScript::ParseDate((String *)&local_60);
      t = tVar1;
      MiniScript::String::release((String *)&local_60);
    }
    dVar2 = dateTimeEpoch();
    local_38.data.number = (double)tVar1 - dVar2;
    value = &local_38;
    local_38.type = Number;
    local_38.noInvoke = false;
    local_38.localOnly = Off;
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,value,true);
  }
  MiniScript::Value::~Value(value);
  MiniScript::Value::~Value(&date);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_dateVal(Context *context, IntrinsicResult partialResult) {
	Value date = context->GetVar("dateStr");
	time_t t;
	if (date.IsNull()) {
		time(&t);
	} else if (date.type == ValueType::Number) {
		return IntrinsicResult(date);
	} else {
		t = ParseDate(date.ToString());
	}
	return IntrinsicResult((double)t - dateTimeEpoch());
}